

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidget::create(QWidget *this,WId window,bool initializeWindow,bool destroyOldWindow)

{
  QWidgetPrivate *this_00;
  long lVar1;
  long lVar2;
  QWExtra *pQVar3;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var4;
  QWidgetPrivate *d;
  _Head_base<0UL,_QTLWExtra_*,_false> _Var5;
  uint uVar6;
  pointer __p;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  __p = (pointer)window;
  if (window != 0) {
    create();
  }
  lVar1 = *(long *)&this->field_0x8;
  if ((((window != 0) || ((*(uint *)(lVar1 + 0x240) & 0x10000000) == 0)) || (this->data->winid == 0)
      ) && (((this_00->data).field_0x12 & 4) == 0)) {
    uVar6 = (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i;
    if ((((char)uVar6 == '\x12') || (__p = (pointer)(ulong)(uVar6 & 0xff), (uVar6 & 0xff) == 0)) &&
       (*(long *)(lVar1 + 0x10) == 0)) {
      (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i = uVar6 | 1;
      uVar6 = 1;
    }
    lVar2 = *(long *)(lVar1 + 0x10);
    if (lVar2 != 0) {
      if ((uVar6 & 1) == 0) {
        if ((((*(uint *)(lVar1 + 0x248) & 0x10) != 0) && ((*(uint *)(lVar1 + 0x248) & 0x20) == 0))
           && (**(long **)(lVar2 + 0x20) == 0)) {
          QWidgetPrivate::createWinId(this_00);
          return;
        }
      }
      else if (((*(QWidgetPrivate **)(lVar2 + 8))->high_attributes[0] & 0x10000000) == 0) {
        QWidgetPrivate::createWinId(*(QWidgetPrivate **)(lVar2 + 8));
      }
    }
    if (create(unsigned_long_long,bool,bool)::paintOnScreenEnv == '\0') {
      create();
    }
    if (create::paintOnScreenEnv == true) {
      __p = (pointer)0x8;
      setAttribute(this,WA_PaintOnScreen,true);
    }
    if (((byte)QCoreApplicationPrivate::attribs & 8) != 0) {
      __p = (pointer)0x64;
      setAttribute(this,WA_NativeWindow,true);
    }
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      pQVar3 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if (pQVar3 == (QWExtra *)0x0) {
        _Var5._M_head_impl = (QTLWExtra *)0x0;
      }
      else {
        _Var5._M_head_impl =
             *(QTLWExtra **)
              &(pQVar3->topextra)._M_t.
               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      }
      if (((_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)_Var5._M_head_impl ==
           (QTLWExtra *)0x0) || ((*(byte *)((long)_Var5._M_head_impl + 0xe1) & 8) == 0)) {
        *(byte *)(this_00->high_attributes + 3) = (byte)this_00->high_attributes[3] | 4;
      }
    }
    QWidgetPrivate::updateIsOpaque(this_00);
    uVar6 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
    if ((uVar6 >> 0x1c & 1) == 0) {
      *(uint *)(*(long *)&this->field_0x8 + 0x240) = uVar6 | 0x10000000;
    }
    QWidgetPrivate::create(this_00);
    uVar6 = (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i;
    if ((uVar6 & 0xff) != 0x11 && (uVar6 & 1) != 0) {
      QWidgetPrivate::createTLExtra(this_00);
      _Var4.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
           (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
           super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      __p = (pointer)operator_new(0xa8);
      QWidgetRepaintManager::QWidgetRepaintManager((QWidgetRepaintManager *)__p,this);
      std::__uniq_ptr_impl<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::
      reset((__uniq_ptr_impl<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_> *)
            ((long)_Var4.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                   super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                   super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 8),__p);
    }
    QWidgetPrivate::setModal_sys(this_00);
    if (((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
        (lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x10), lVar1 != 0)) &&
       ((*(byte *)(*(long *)(lVar1 + 8) + 0x245) & 0x80) != 0)) {
      __p = (pointer)0x4f;
      setAttribute(this,WA_DropSiteRegistered,true);
    }
    if ((*(byte *)(*(long *)&this->field_0x8 + 0x242) & 0x20) != 0) {
      QWidgetPrivate::setWindowIcon_sys(this_00);
    }
    if ((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
       (QWidgetPrivate::createTLExtra(this_00),
       *(long *)((long)(((this_00->extra)._M_t.
                         super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                         super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                         super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                       super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x50) !=
       0)) {
      QWidgetPrivate::createTLExtra(this_00);
      __p = (pointer)((long)(((this_00->extra)._M_t.
                              super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                              super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                              super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                            super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x40
                     );
      QWidgetPrivate::setWindowIconText_helper(this_00,(QString *)__p);
    }
    if ((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
       (QWidgetPrivate::createTLExtra(this_00),
       *(long *)((long)(((this_00->extra)._M_t.
                         super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                         super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                         super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                       super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x38) !=
       0)) {
      QWidgetPrivate::createTLExtra(this_00);
      __p = (pointer)((long)(((this_00->extra)._M_t.
                              super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                              super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                              super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                            super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x28
                     );
      QWidgetPrivate::setWindowTitle_helper(this_00,(QString *)__p);
    }
    if ((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
       (QWidgetPrivate::createTLExtra(this_00),
       *(long *)((long)(((this_00->extra)._M_t.
                         super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                         super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                         super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                       super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x80) !=
       0)) {
      QWidgetPrivate::createTLExtra(this_00);
      QWidgetPrivate::setWindowFilePath_helper(this_00,(QString *)__p);
    }
    uVar6 = (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i;
    if (((uVar6 & 1) != 0 && (uVar6 & 0xff) != 0x11) &&
       ((*(byte *)(*(long *)&this->field_0x8 + 0x242) & 0x20) == 0)) {
      QWidgetPrivate::setWindowIcon_sys(this_00);
    }
    QWidgetPrivate::updateFrameStrut(this_00);
  }
  return;
}

Assistant:

void QWidget::create(WId window, bool initializeWindow, bool destroyOldWindow)
{
    Q_UNUSED(initializeWindow);
    Q_UNUSED(destroyOldWindow);

    Q_D(QWidget);
    if (Q_UNLIKELY(window))
        qWarning("QWidget::create(): Parameter 'window' does not have any effect.");
    if (testAttribute(Qt::WA_WState_Created) && window == 0 && internalWinId())
        return;

    if (d->data.in_destructor)
        return;

    Qt::WindowType type = windowType();
    Qt::WindowFlags &flags = data->window_flags;

    if ((type == Qt::Widget || type == Qt::SubWindow) && !parentWidget()) {
        type = Qt::Window;
        flags |= Qt::Window;
    }

    if (QWidget *parent = parentWidget()) {
        if (type & Qt::Window) {
            if (!parent->testAttribute(Qt::WA_WState_Created))
                parent->createWinId();
        } else if (testAttribute(Qt::WA_NativeWindow) && !parent->internalWinId()
                   && !testAttribute(Qt::WA_DontCreateNativeAncestors)) {
            // We're about to create a native child widget that doesn't have a native parent;
            // enforce a native handle for the parent unless the Qt::WA_DontCreateNativeAncestors
            // attribute is set.
            d->createWinId();
            // Nothing more to do.
            Q_ASSERT(testAttribute(Qt::WA_WState_Created));
            Q_ASSERT(internalWinId());
            return;
        }
    }


    static const bool paintOnScreenEnv = qEnvironmentVariableIntValue("QT_ONSCREEN_PAINT") > 0;
    if (paintOnScreenEnv)
        setAttribute(Qt::WA_PaintOnScreen);

    if (QApplicationPrivate::testAttribute(Qt::AA_NativeWindows))
        setAttribute(Qt::WA_NativeWindow);

    if (isWindow()) {
        // Make top levels automatically respect safe areas by default
        auto *topExtra = d->maybeTopData();
        if (!topExtra || !topExtra->explicitContentsMarginsRespectsSafeArea) {
            setAttribute_internal(Qt::WA_ContentsMarginsRespectsSafeArea,
                true, data, d);
        }
    }

    d->updateIsOpaque();

    setAttribute(Qt::WA_WState_Created);                        // set created flag
    d->create();

    // A real toplevel window needs a paint manager
    if (isWindow() && windowType() != Qt::Desktop)
        d->topData()->repaintManager.reset(new QWidgetRepaintManager(this));

    d->setModal_sys();

    if (!isWindow() && parentWidget() && parentWidget()->testAttribute(Qt::WA_DropSiteRegistered))
        setAttribute(Qt::WA_DropSiteRegistered, true);

    // need to force the resting of the icon after changing parents
    if (testAttribute(Qt::WA_SetWindowIcon))
        d->setWindowIcon_sys();

    if (isWindow() && !d->topData()->iconText.isEmpty())
        d->setWindowIconText_helper(d->topData()->iconText);
    if (isWindow() && !d->topData()->caption.isEmpty())
        d->setWindowTitle_helper(d->topData()->caption);
    if (isWindow() && !d->topData()->filePath.isEmpty())
        d->setWindowFilePath_helper(d->topData()->filePath);
    if (windowType() != Qt::Desktop) {
        d->updateSystemBackground();

        if (isWindow() && !testAttribute(Qt::WA_SetWindowIcon))
            d->setWindowIcon_sys();
    }

    // Frame strut update needed in cases where there are native widgets such as QGLWidget,
    // as those force native window creation on their ancestors before they are shown.
    // If the strut is not updated, any subsequent move of the top level window before show
    // will cause window frame to be ignored when positioning the window.
    // Note that this only helps on platforms that handle window creation synchronously.
    d->updateFrameStrut();
}